

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_extension_instances_free(ly_ctx *ctx,lys_ext_instance **e,uint size)

{
  char **ppcVar1;
  LY_STMT stmt;
  lys_ext_instance *plVar2;
  lyext_plugin *plVar3;
  char *value;
  long lVar4;
  lys_node *plVar5;
  lys_restr *restr;
  lys_iffeature *iffeature;
  lys_type *type;
  lys_tpdf *plVar6;
  ly_ctx *plVar7;
  undefined8 *puVar8;
  long *plVar9;
  long *plVar10;
  lys_ext *plVar11;
  lys_ext *plVar12;
  lys_node *node;
  void *__ptr;
  lys_tpdf *tpdf;
  lys_when *w;
  lys_when *plVar13;
  lys_when *plVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  char *pcVar18;
  undefined8 *puVar19;
  lys_tpdf *plVar20;
  lyext_substmt *local_68;
  ulong local_60;
  ulong local_58;
  ly_ctx *local_50;
  lys_ext_instance **local_48;
  lys_ext *local_40;
  int local_34;
  
  if ((e == (lys_ext_instance **)0x0 || size == 0) || (*e == (lys_ext_instance *)0x0)) {
    return;
  }
  uVar15 = (ulong)size;
  uVar16 = 0;
  local_60 = uVar15;
  local_50 = ctx;
  local_48 = e;
LAB_00156cf8:
  plVar2 = e[uVar16];
  if (plVar2 != (lys_ext_instance *)0x0) {
    if ((plVar2->flags & 1) == 0) {
      if ((plVar2->flags & 2) != 0) {
        free(plVar2->def);
        e[uVar16]->def = (lys_ext *)0x0;
        yang_free_ext_data((yang_ext_substmt *)e[uVar16]->parent);
      }
      plVar7 = local_50;
      lys_extension_instances_free(local_50,e[uVar16]->ext,(uint)e[uVar16]->ext_size);
      lydict_remove(plVar7,e[uVar16]->arg_value);
    }
    plVar12 = e[uVar16]->def;
    if (((plVar12 != (lys_ext *)0x0) && (plVar3 = plVar12->plugin, plVar3 != (lyext_plugin *)0x0))
       && (plVar3->type == LYEXT_COMPLEX)) {
      plVar12 = e[uVar16][1].def;
      uVar15 = 0;
      local_58 = uVar16;
      local_40 = plVar12;
      do {
        local_34 = (int)uVar15;
        stmt = *(LY_STMT *)(plVar12->padding + uVar15 * 0x18 + -0x1b);
        plVar11 = plVar12;
        iVar17 = local_34;
        switch(stmt) {
        case LY_STMT_UNKNOWN:
          goto switchD_00156dbb_caseD_0;
        case LY_STMT_ARGUMENT:
        case LY_STMT_BASE:
        case LY_STMT_BELONGSTO:
        case LY_STMT_CONTACT:
        case LY_STMT_DEFAULT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERRTAG:
        case LY_STMT_ERRMSG:
        case LY_STMT_KEY:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PATH:
        case LY_STMT_PREFIX:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_REVISIONDATE:
        case LY_STMT_UNITS:
          puVar8 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (stmt,(lys_ext_instance_complex *)e[local_58],&local_68);
          plVar7 = local_50;
          plVar11 = local_40;
          e = local_48;
          if ((puVar8 != (undefined8 *)0x0) && (pcVar18 = (char *)*puVar8, pcVar18 != (char *)0x0))
          {
            if (LY_STMT_CARD_MAND < local_68->cardinality) {
              value = *(char **)pcVar18;
              while (value != (char *)0x0) {
                pcVar18 = pcVar18 + 8;
                lydict_remove(plVar7,value);
                value = *(char **)pcVar18;
              }
              free((void *)*puVar8);
              plVar7 = local_50;
              if (stmt != LY_STMT_ARGUMENT) {
                plVar11 = local_40;
                e = local_48;
                if (stmt != LY_STMT_BELONGSTO) break;
                puVar19 = (undefined8 *)puVar8[1];
                pcVar18 = (char *)*puVar19;
                while (pcVar18 != (char *)0x0) {
                  puVar19 = puVar19 + 1;
                  lydict_remove(plVar7,pcVar18);
                  pcVar18 = (char *)*puVar19;
                }
              }
              w = (lys_when *)puVar8[1];
              goto LAB_00157359;
            }
            lydict_remove(local_50,pcVar18);
            plVar11 = local_40;
            e = local_48;
            if (stmt == LY_STMT_BELONGSTO) {
              lydict_remove(local_50,(char *)puVar8[1]);
              plVar11 = local_40;
              e = local_48;
            }
          }
          break;
        case LY_STMT_VALUE:
        case LY_STMT_MAX:
        case LY_STMT_MIN:
        case LY_STMT_POSITION:
          plVar2 = e[local_58];
          lVar4 = *(long *)(plVar12->padding + uVar15 * 0x18 + -0x13);
          if (((1 < *(uint *)(plVar12->padding + uVar15 * 0x18 + -0xb)) &&
              (*(long *)((long)&plVar2[1].arg_value + lVar4 + 4) != 0)) &&
             (__ptr = (void *)**(long **)((long)&plVar2[1].arg_value + lVar4 + 4),
             __ptr != (void *)0x0)) {
            uVar15 = 1;
            do {
              free(__ptr);
              __ptr = *(void **)(*(long *)((long)&plVar2[1].arg_value + lVar4 + 4) + uVar15 * 8);
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (__ptr != (void *)0x0);
          }
          w = *(lys_when **)((long)&plVar2[1].arg_value + lVar4 + 4);
LAB_00157359:
          free(w);
          plVar11 = local_40;
          e = local_48;
          break;
        case LY_STMT_VERSION:
        case LY_STMT_MODIFIER:
        case LY_STMT_REQINSTANCE:
        case LY_STMT_YINELEM:
        case LY_STMT_CONFIG:
        case LY_STMT_MANDATORY:
        case LY_STMT_ORDEREDBY:
        case LY_STMT_STATUS:
        case LY_STMT_SUBMODULE:
          break;
        case LY_STMT_DIGITS:
        case LY_STMT_MODULE:
          if (1 < *(uint *)(plVar12->padding + uVar15 * 0x18 + -0xb)) {
            free(*(void **)((long)&e[local_58][1].arg_value +
                           *(long *)(plVar12->padding + uVar15 * 0x18 + -0x13) + 4));
            plVar11 = local_40;
          }
          break;
        case LY_STMT_UNIQUE:
          plVar9 = (long *)lys_ext_complex_get_substmt
                                     (LY_STMT_UNIQUE,(lys_ext_instance_complex *)e[local_58],
                                      (lyext_substmt **)0x0);
          iVar17 = local_34;
          plVar7 = local_50;
          plVar11 = local_40;
          if ((plVar9 != (long *)0x0) &&
             (w = (lys_when *)*plVar9, e = local_48, w != (lys_when *)0x0)) {
            if (*(uint *)(plVar12->padding + uVar15 * 0x18 + -0xb) < 2) {
              plVar10 = (long *)*plVar9;
              if ((char)plVar10[1] != '\0') {
                uVar15 = 0;
                do {
                  lydict_remove(plVar7,*(char **)(*plVar10 + uVar15 * 8));
                  uVar15 = uVar15 + 1;
                  plVar10 = (long *)*plVar9;
                } while (uVar15 < *(byte *)(plVar10 + 1));
              }
              free((void *)*plVar10);
              tpdf = (lys_tpdf *)*plVar9;
              goto LAB_00157284;
            }
            pcVar18 = w->cond;
            plVar14 = w;
            while (local_50 = plVar7, pcVar18 != (char *)0x0) {
              plVar9 = (long *)plVar14->cond;
              if ((char)plVar9[1] != '\0') {
                uVar15 = 0;
                do {
                  lydict_remove(plVar7,*(char **)(*plVar9 + uVar15 * 8));
                  uVar15 = uVar15 + 1;
                  plVar9 = (long *)plVar14->cond;
                } while (uVar15 < *(byte *)(plVar9 + 1));
              }
              free((void *)*plVar9);
              free(plVar14->cond);
              ppcVar1 = &plVar14->dsc;
              plVar14 = (lys_when *)&plVar14->dsc;
              plVar7 = local_50;
              pcVar18 = *ppcVar1;
            }
            goto LAB_00157359;
          }
          break;
        case LY_STMT_ACTION:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_GROUPING:
        case LY_STMT_INPUT:
        case LY_STMT_LEAF:
        case LY_STMT_LEAFLIST:
        case LY_STMT_LIST:
        case LY_STMT_NOTIFICATION:
        case LY_STMT_OUTPUT:
        case LY_STMT_USES:
        case LY_STMT_RPC:
          plVar2 = e[local_58];
          lVar4 = *(long *)(plVar12->padding + uVar15 * 0x18 + -0x13);
          node = *(lys_node **)((long)&plVar2[1].arg_value + lVar4 + 4);
          while (node != (lys_node *)0x0) {
            plVar5 = node->next;
            lys_node_free(node,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
            node = plVar5;
          }
          *(undefined8 *)((long)&plVar2[1].arg_value + lVar4 + 4) = 0;
          plVar11 = local_40;
          e = local_48;
          break;
        case LY_STMT_TYPEDEF:
          plVar9 = (long *)lys_ext_complex_get_substmt
                                     (LY_STMT_TYPEDEF,(lys_ext_instance_complex *)e[local_58],
                                      (lyext_substmt **)0x0);
          iVar17 = local_34;
          plVar7 = local_50;
          plVar11 = local_40;
          e = local_48;
          if ((plVar9 != (long *)0x0) && (tpdf = (lys_tpdf *)*plVar9, tpdf != (lys_tpdf *)0x0)) {
            if (1 < *(uint *)(plVar12->padding + uVar15 * 0x18 + -0xb)) {
              plVar20 = (lys_tpdf *)tpdf->name;
              plVar6 = tpdf;
              while (plVar20 != (lys_tpdf *)0x0) {
                lys_tpdf_free(plVar7,plVar20);
                free(plVar6->name);
                plVar20 = (lys_tpdf *)plVar6->dsc;
                plVar6 = (lys_tpdf *)&plVar6->dsc;
              }
              goto LAB_00157284;
            }
            lys_tpdf_free(local_50,tpdf);
LAB_00157356:
            w = (lys_when *)*plVar9;
            goto LAB_00157359;
          }
          break;
        case LY_STMT_TYPE:
          plVar9 = (long *)lys_ext_complex_get_substmt
                                     (LY_STMT_TYPE,(lys_ext_instance_complex *)e[local_58],
                                      (lyext_substmt **)0x0);
          iVar17 = local_34;
          plVar7 = local_50;
          plVar11 = local_40;
          e = local_48;
          if ((plVar9 == (long *)0x0) || (tpdf = (lys_tpdf *)*plVar9, tpdf == (lys_tpdf *)0x0))
          break;
          if (*(uint *)(plVar12->padding + uVar15 * 0x18 + -0xb) < 2) {
            lys_type_free(local_50,(lys_type *)tpdf);
            goto LAB_00157356;
          }
          type = (lys_type *)tpdf->name;
          plVar20 = tpdf;
          while (type != (lys_type *)0x0) {
            lys_type_free(plVar7,type);
            free(plVar20->name);
            type = (lys_type *)plVar20->dsc;
            plVar20 = (lys_tpdf *)&plVar20->dsc;
          }
LAB_00157284:
          free(tpdf);
          plVar12 = local_40;
          e = local_48;
          goto switchD_00156dbb_default;
        case LY_STMT_IFFEATURE:
          puVar8 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (LY_STMT_IFFEATURE,(lys_ext_instance_complex *)e[local_58],
                              (lyext_substmt **)0x0);
          plVar7 = local_50;
          plVar11 = local_40;
          if ((puVar8 != (undefined8 *)0x0) &&
             (w = (lys_when *)*puVar8, e = local_48, w != (lys_when *)0x0)) {
            if (1 < *(uint *)(plVar12->padding + uVar15 * 0x18 + -0xb)) {
              iffeature = (lys_iffeature *)w->cond;
              plVar14 = w;
              while (iffeature != (lys_iffeature *)0x0) {
                plVar14 = (lys_when *)&plVar14->dsc;
                lys_iffeature_free(plVar7,iffeature,'\x01');
                iffeature = *(lys_iffeature **)plVar14;
              }
              goto LAB_00157359;
            }
            lys_iffeature_free(local_50,(lys_iffeature *)w,'\x01');
            plVar11 = local_40;
            e = local_48;
          }
          break;
        case LY_STMT_LENGTH:
        case LY_STMT_MUST:
        case LY_STMT_PATTERN:
        case LY_STMT_RANGE:
          plVar9 = (long *)lys_ext_complex_get_substmt
                                     (stmt,(lys_ext_instance_complex *)e[local_58],
                                      (lyext_substmt **)0x0);
          iVar17 = local_34;
          plVar7 = local_50;
          plVar11 = local_40;
          e = local_48;
          if ((plVar9 != (long *)0x0) && (tpdf = (lys_tpdf *)*plVar9, tpdf != (lys_tpdf *)0x0)) {
            if (*(uint *)(plVar12->padding + uVar15 * 0x18 + -0xb) < 2) {
              lys_restr_free(local_50,(lys_restr *)tpdf);
              goto LAB_00157356;
            }
            restr = (lys_restr *)tpdf->name;
            plVar20 = tpdf;
            while (restr != (lys_restr *)0x0) {
              lys_restr_free(plVar7,restr);
              free(plVar20->name);
              restr = (lys_restr *)plVar20->dsc;
              plVar20 = (lys_tpdf *)&plVar20->dsc;
            }
            goto LAB_00157284;
          }
          break;
        case LY_STMT_WHEN:
          puVar8 = (undefined8 *)
                   lys_ext_complex_get_substmt
                             (LY_STMT_WHEN,(lys_ext_instance_complex *)e[local_58],
                              (lyext_substmt **)0x0);
          plVar7 = local_50;
          plVar11 = local_40;
          if ((puVar8 != (undefined8 *)0x0) &&
             (w = (lys_when *)*puVar8, e = local_48, w != (lys_when *)0x0)) {
            if (1 < *(uint *)(plVar12->padding + uVar15 * 0x18 + -0xb)) {
              plVar14 = (lys_when *)w->cond;
              plVar13 = w;
              while (plVar14 != (lys_when *)0x0) {
                plVar13 = (lys_when *)&plVar13->dsc;
                lys_when_free(plVar7,plVar14);
                plVar14 = *(lys_when **)plVar13;
              }
              goto LAB_00157359;
            }
            lys_when_free(local_50,w);
            plVar11 = local_40;
            e = local_48;
          }
          break;
        case LY_STMT_REVISION:
          plVar9 = (long *)lys_ext_complex_get_substmt
                                     (LY_STMT_REVISION,(lys_ext_instance_complex *)e[local_58],
                                      (lyext_substmt **)0x0);
          iVar17 = local_34;
          plVar7 = local_50;
          plVar11 = local_40;
          e = local_48;
          if ((plVar9 != (long *)0x0) && (tpdf = (lys_tpdf *)*plVar9, tpdf != (lys_tpdf *)0x0)) {
            if (*(uint *)(plVar12->padding + uVar15 * 0x18 + -0xb) < 2) {
              lydict_remove(local_50,*(char **)&tpdf->flags);
              lydict_remove(plVar7,*(char **)(*plVar9 + 0x20));
              lys_extension_instances_free
                        (plVar7,*(lys_ext_instance ***)(*plVar9 + 0x10),
                         (uint)*(byte *)(*plVar9 + 0xb));
              goto LAB_00157356;
            }
            pcVar18 = tpdf->name;
            plVar20 = tpdf;
            while (pcVar18 != (char *)0x0) {
              lydict_remove(plVar7,*(char **)(pcVar18 + 0x18));
              lydict_remove(plVar7,*(char **)(plVar20->name + 0x20));
              lys_extension_instances_free
                        (plVar7,*(lys_ext_instance ***)(plVar20->name + 0x10),
                         (uint)(byte)plVar20->name[0xb]);
              free(plVar20->name);
              ppcVar1 = &plVar20->dsc;
              plVar20 = (lys_tpdf *)&plVar20->dsc;
              pcVar18 = *ppcVar1;
            }
            goto LAB_00157284;
          }
          break;
        default:
          goto switchD_00156dbb_default;
        }
        plVar12 = plVar11;
        iVar17 = local_34;
switchD_00156dbb_default:
        uVar15 = (ulong)(iVar17 + 1);
      } while( true );
    }
    goto LAB_0015738f;
  }
  goto LAB_00157398;
switchD_00156dbb_caseD_0:
  uVar15 = local_60;
  uVar16 = local_58;
LAB_0015738f:
  free(e[uVar16]);
LAB_00157398:
  uVar16 = uVar16 + 1;
  if (uVar16 == uVar15) {
    free(e);
    return;
  }
  goto LAB_00156cf8;
}

Assistant:

void
lys_extension_instances_free(struct ly_ctx *ctx, struct lys_ext_instance **e, unsigned int size)
{
    unsigned int i, j, k;
    struct lyext_substmt *substmt;
    void **pp, **start;
    struct lys_node *siter, *snext;

#define EXTCOMPLEX_FREE_STRUCT(STMT, TYPE, FUNC, FREE, ARGS...)                               \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)e[i], NULL);    \
    if (!pp || !(*pp)) { break; }                                                             \
    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */                    \
        for (start = pp = *pp; *pp; pp++) {                                                   \
            FUNC(ctx, (TYPE *)(*pp), ##ARGS);                                                 \
            if (FREE) { free(*pp); }                                                          \
        }                                                                                     \
        free(start);                                                                          \
    } else { /* single item */                                                                \
        FUNC(ctx, (TYPE *)(*pp), ##ARGS);                                                     \
        if (FREE) { free(*pp); }                                                              \
    }

    if (!size || !e || !(*e)) {
        return;
    }

    for (i = 0; i < size; i++) {
        if (!e[i]) {
            continue;
        }

        if (e[i]->flags & (LYEXT_OPT_INHERIT)) {
            /* no free, this is just a shadow copy of the original extension instance */
        } else {
            if (e[i]->flags & (LYEXT_OPT_YANG)) {
                free(e[i]->def);     /* remove name of instance extension */
                e[i]->def = NULL;
                yang_free_ext_data((struct yang_ext_substmt *)e[i]->parent); /* remove backup part of yang file */
            }
            lys_extension_instances_free(ctx, e[i]->ext, e[i]->ext_size);
            lydict_remove(ctx, e[i]->arg_value);
        }

        if (e[i]->def && e[i]->def->plugin && e[i]->def->plugin->type == LYEXT_COMPLEX) {
            substmt = ((struct lys_ext_instance_complex *)e[i])->substmt;
            for (j = 0; substmt[j].stmt; j++) {
                switch(substmt[j].stmt) {
                case LY_STMT_DESCRIPTION:
                case LY_STMT_REFERENCE:
                case LY_STMT_UNITS:
                case LY_STMT_ARGUMENT:
                case LY_STMT_DEFAULT:
                case LY_STMT_ERRTAG:
                case LY_STMT_ERRMSG:
                case LY_STMT_PREFIX:
                case LY_STMT_NAMESPACE:
                case LY_STMT_PRESENCE:
                case LY_STMT_REVISIONDATE:
                case LY_STMT_KEY:
                case LY_STMT_BASE:
                case LY_STMT_BELONGSTO:
                case LY_STMT_CONTACT:
                case LY_STMT_ORGANIZATION:
                case LY_STMT_PATH:
                    lys_extcomplex_free_str(ctx, (struct lys_ext_instance_complex *)e[i], substmt[j].stmt);
                    break;
                case LY_STMT_TYPE:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_TYPE, struct lys_type, lys_type_free, 1);
                    break;
                case LY_STMT_TYPEDEF:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_TYPEDEF, struct lys_tpdf, lys_tpdf_free, 1);
                    break;
                case LY_STMT_IFFEATURE:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_IFFEATURE, struct lys_iffeature, lys_iffeature_free, 0, 1);
                    break;
                case LY_STMT_MAX:
                case LY_STMT_MIN:
                case LY_STMT_POSITION:
                case LY_STMT_VALUE:
                    pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME && *pp) {
                        for(k = 0; ((uint32_t**)(*pp))[k]; k++) {
                            free(((uint32_t**)(*pp))[k]);
                        }
                    }
                    free(*pp);
                    break;
                case LY_STMT_DIGITS:
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) {
                        /* free the array */
                        pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                        free(*pp);
                    }
                    break;
                case LY_STMT_MODULE:
                    /* modules are part of the context, so they will be freed there */
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) {
                        /* free the array */
                        pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                        free(*pp);
                    }
                    break;
                case LY_STMT_ACTION:
                case LY_STMT_ANYDATA:
                case LY_STMT_ANYXML:
                case LY_STMT_CASE:
                case LY_STMT_CHOICE:
                case LY_STMT_CONTAINER:
                case LY_STMT_GROUPING:
                case LY_STMT_INPUT:
                case LY_STMT_LEAF:
                case LY_STMT_LEAFLIST:
                case LY_STMT_LIST:
                case LY_STMT_NOTIFICATION:
                case LY_STMT_OUTPUT:
                case LY_STMT_RPC:
                case LY_STMT_USES:
                    pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                    LY_TREE_FOR_SAFE((struct lys_node *)(*pp), snext, siter) {
                        lys_node_free(siter, NULL, 0);
                    }
                    *pp = NULL;
                    break;
                case LY_STMT_UNIQUE:
                    pp = lys_ext_complex_get_substmt(LY_STMT_UNIQUE, (struct lys_ext_instance_complex *)e[i], NULL);
                    if (!pp || !(*pp)) {
                        break;
                    }
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */
                        for (start = pp = *pp; *pp; pp++) {
                            for (k = 0; k < (*(struct lys_unique**)pp)->expr_size; k++) {
                                lydict_remove(ctx, (*(struct lys_unique**)pp)->expr[k]);
                            }
                            free((*(struct lys_unique**)pp)->expr);
                            free(*pp);
                        }
                        free(start);
                    } else { /* single item */
                        for (k = 0; k < (*(struct lys_unique**)pp)->expr_size; k++) {
                            lydict_remove(ctx, (*(struct lys_unique**)pp)->expr[k]);
                        }
                        free((*(struct lys_unique**)pp)->expr);
                        free(*pp);
                    }
                    break;
                case LY_STMT_LENGTH:
                case LY_STMT_MUST:
                case LY_STMT_PATTERN:
                case LY_STMT_RANGE:
                    EXTCOMPLEX_FREE_STRUCT(substmt[j].stmt, struct lys_restr, lys_restr_free, 1);
                    break;
                case LY_STMT_WHEN:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_WHEN, struct lys_when, lys_when_free, 0);
                    break;
                case LY_STMT_REVISION:
                    pp = lys_ext_complex_get_substmt(LY_STMT_REVISION, (struct lys_ext_instance_complex *)e[i], NULL);
                    if (!pp || !(*pp)) {
                        break;
                    }
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */
                        for (start = pp = *pp; *pp; pp++) {
                            lydict_remove(ctx, (*(struct lys_revision**)pp)->dsc);
                            lydict_remove(ctx, (*(struct lys_revision**)pp)->ref);
                            lys_extension_instances_free(ctx, (*(struct lys_revision**)pp)->ext,
                                                         (*(struct lys_revision**)pp)->ext_size);
                            free(*pp);
                        }
                        free(start);
                    } else { /* single item */
                        lydict_remove(ctx, (*(struct lys_revision**)pp)->dsc);
                        lydict_remove(ctx, (*(struct lys_revision**)pp)->ref);
                        lys_extension_instances_free(ctx, (*(struct lys_revision**)pp)->ext,
                                                     (*(struct lys_revision**)pp)->ext_size);
                        free(*pp);
                    }
                    break;
                default:
                    /* nothing to free */
                    break;
                }
            }
        }

        free(e[i]);
    }
    free(e);

#undef EXTCOMPLEX_FREE_STRUCT
}